

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.H
# Opt level: O0

void __thiscall
Fl_Help_Font_Stack::pop(Fl_Help_Font_Stack *this,Fl_Font *f,Fl_Fontsize *s,Fl_Color *c)

{
  Fl_Color *c_local;
  Fl_Fontsize *s_local;
  Fl_Font *f_local;
  Fl_Help_Font_Stack *this_local;
  
  if (this->nfonts_ != 0) {
    this->nfonts_ = this->nfonts_ - 1;
  }
  top(this,f,s,c);
  fl_font(*f,*s);
  fl_color(*c);
  return;
}

Assistant:

void pop(Fl_Font &f, Fl_Fontsize &s, Fl_Color &c) { 
    if (nfonts_ > 0) nfonts_ --;
    top(f, s, c);
    fl_font(f, s); fl_color(c);
  }